

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

void __thiscall QLineEditPrivate::selectionChanged(QLineEditPrivate *this)

{
  long lVar1;
  QWidget *this_00;
  QWidgetLineControl *pQVar2;
  undefined8 uVar3;
  int iVar4;
  QStyle *pQVar5;
  long in_FS_OFFSET;
  bool visible;
  QStyleOptionFrame opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QTextLayout::preeditAreaText();
  uVar3 = opt.super_QStyleOption.rect._0_8_;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&opt);
  if (uVar3 == 0) {
    opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionFrame::QStyleOptionFrame(&opt);
    (**(code **)(*(long *)this_00 + 0x1a0))(this_00,&opt);
    pQVar2 = this->control;
    if (((pQVar2->m_text).d.size == 0) || (pQVar2->m_selend <= pQVar2->m_selstart)) {
      visible = QWidget::hasFocus(this_00);
    }
    else {
      pQVar5 = QWidget::style(this_00);
      iVar4 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x1c,&opt,this_00,0);
      visible = iVar4 != 0;
    }
    setCursorVisible(this,visible);
    QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  }
  QLineEdit::selectionChanged((QLineEdit *)this_00);
  pQVar2 = this->control;
  opt.super_QStyleOption._36_4_ = -1;
  opt.super_QStyleOption._32_4_ = opt.super_QStyleOption._36_4_;
  if ((pQVar2->m_text).d.size != 0 && pQVar2->m_selstart < pQVar2->m_selend) {
    opt.super_QStyleOption._36_4_ = pQVar2->m_selend;
    opt.super_QStyleOption._32_4_ = pQVar2->m_selstart;
  }
  opt.super_QStyleOption._0_8_ = QPixmap::load;
  opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x121;
  opt.super_QStyleOption.direction = 0xaaaaaaaa;
  opt.super_QStyleOption.rect.y2.m_i = pQVar2->m_cursor;
  opt.super_QStyleOption.rect.x2.m_i = -1;
  opt.super_QStyleOption.rect._0_8_ = this_00;
  QAccessible::updateAccessibility((QAccessibleEvent *)&opt);
  QAccessibleTextSelectionEvent::~QAccessibleTextSelectionEvent
            ((QAccessibleTextSelectionEvent *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditPrivate::selectionChanged()
{
    Q_Q(QLineEdit);
    if (control->preeditAreaText().isEmpty()) {
        QStyleOptionFrame opt;
        q->initStyleOption(&opt);
        bool showCursor = control->hasSelectedText() ?
                          q->style()->styleHint(QStyle::SH_BlinkCursorWhenTextSelected, &opt, q):
                          q->hasFocus();
        setCursorVisible(showCursor);
    }

    emit q->selectionChanged();
#if QT_CONFIG(accessibility)
    QAccessibleTextSelectionEvent ev(q, control->selectionStart(), control->selectionEnd());
    ev.setCursorPosition(control->cursorPosition());
    QAccessible::updateAccessibility(&ev);
#endif
}